

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O2

int SUNHashMap_Insert(SUNHashMap map,char *key,void *value)

{
  int start;
  uint64_t uVar1;
  SUNHashMapKeyValue pSVar2;
  int iVar3;
  
  iVar3 = -1;
  if (value == (void *)0x0 || (key == (char *)0x0 || map == (SUNHashMap)0x0)) {
    return -1;
  }
  uVar1 = fnv1a_hash(key);
  start = (int)(uVar1 % (ulong)(long)map->max_size);
  if (map->buckets[start] != (SUNHashMapKeyValue)0x0) {
    start = SUNHashMap_Iterate(map,start,sunHashMapLinearProbeInsert,(void *)0x0);
    if (start < 0) {
      return -1;
    }
    if (start == map->max_size) {
      return -2;
    }
  }
  pSVar2 = (SUNHashMapKeyValue)malloc(0x10);
  if (pSVar2 != (SUNHashMapKeyValue)0x0) {
    pSVar2->key = key;
    pSVar2->value = value;
    map->buckets[start] = pSVar2;
    map->size = map->size + 1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int SUNHashMap_Insert(SUNHashMap map, const char* key, void* value)
{
  int idx;
  int retval;
  SUNHashMapKeyValue kvp;

  if (map == NULL || key == NULL || value == NULL) { return (-1); }

  /* We want the index to be in (0, map->max_size) */
  idx = (int)(fnv1a_hash(key) % map->max_size);

  /* Check if the bucket is already filled */
  if (map->buckets[idx] != NULL)
  {
    /* Find the next open spot */
    retval = SUNHashMap_Iterate(map, idx, sunHashMapLinearProbeInsert, NULL);
    if (retval < 0) { return (-1); /* error occurred */ }
    if (retval == map->max_size) { return (-2); /* no open entry */ }

    idx = retval;
  }

  /* Create the key-value pair */
  kvp = (SUNHashMapKeyValue)malloc(sizeof(*kvp));
  if (kvp == NULL) { return (-1); }

  kvp->key   = key;
  kvp->value = value;

  /* Insert the key-value pair */
  map->buckets[idx] = kvp;
  map->size++;

  return (0);
}